

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Expression * __thiscall
ot::commissioner::Interpreter::Read_abi_cxx11_(Expression *__return_storage_ptr__,Interpreter *this)

{
  string local_38;
  Interpreter *local_18;
  Interpreter *this_local;
  
  local_18 = this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Console::Read_abi_cxx11_();
  ParseExpression(__return_storage_ptr__,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Expression Interpreter::Read()
{
    return ParseExpression(Console::Read());
}